

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnView::scrollTo(QColumnView *this,QModelIndex *index,ScrollHint hint)

{
  QColumnViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QWidgetData *pQVar2;
  ulong uVar3;
  QAbstractItemView **ppQVar4;
  QAbstractItemView *pQVar5;
  int iVar6;
  LayoutDirection LVar7;
  ulong uVar8;
  QWidget *pQVar9;
  QStyle *pQVar10;
  QScrollBar *this_01;
  int iVar11;
  ulong uVar12;
  int iVar13;
  DeletionPolicy DVar14;
  long in_FS_OFFSET;
  undefined8 local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) &&
     (this_00 = *(QColumnViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8, (this_00->columns).d.size != 0)) {
    iVar6 = QAbstractAnimation::state();
    if (iVar6 != 2) {
      QAbstractAnimation::stop();
      QColumnViewPrivate::closeColumns(this_00,index,true);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (index->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_78 = (undefined1 *)0xffffffffffffffff;
        puStack_70 = (undefined1 *)0x0;
        local_68 = (undefined1 *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x68))(&local_78,pQVar1,index);
      }
      if ((this_00->columns).d.size == 0) {
        uVar8 = 1;
        iVar6 = 0;
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        iVar6 = 0;
        do {
          QAbstractItemView::rootIndex
                    ((QModelIndex *)&local_58,(QAbstractItemView *)(this_00->columns).d.ptr[uVar12])
          ;
          if ((((int)local_78 == local_58._0_4_) && (local_78._4_4_ == local_58._4_4_)) &&
             ((puStack_70 == (undefined1 *)local_58._8_8_ &&
              (local_68 == (undefined1 *)local_58._16_8_)))) break;
          pQVar2 = ((this_00->columns).d.ptr[uVar12]->super_QAbstractScrollArea).super_QFrame.
                   super_QWidget.data;
          iVar6 = ((iVar6 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)(this_00->columns).d.size);
        uVar8 = (ulong)((int)uVar12 + 1);
      }
      uVar3 = (this_00->columns).d.size;
      if (uVar3 != uVar12) {
        ppQVar4 = (this_00->columns).d.ptr;
        pQVar2 = (ppQVar4[uVar12]->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
        iVar13 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
        if (uVar8 < uVar3) {
          pQVar2 = (ppQVar4[uVar8]->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
          iVar13 = ((iVar13 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
        }
        LVar7 = QWidget::layoutDirection((QWidget *)this);
        if (LVar7 == RightToLeft) {
          pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          iVar11 = ((pQVar9->data->crect).x2.m_i - (iVar6 + (pQVar9->data->crect).x1.m_i)) + 1;
          iVar6 = iVar11 - iVar13;
        }
        else {
          iVar11 = iVar13 + iVar6;
        }
        iVar13 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget + 0x2b0))(this);
        if (iVar6 != -iVar13 && SBORROW4(iVar6,-iVar13) == iVar6 + iVar13 < 0) {
          iVar13 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget + 0x2b0))(this);
          pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          if (iVar11 <= ((pQVar9->data->crect).x2.m_i - (iVar13 + (pQVar9->data->crect).x1.m_i)) + 1
             ) {
            pQVar5 = (this_00->columns).d.ptr[uVar12];
            (**(code **)(*(long *)&(pQVar5->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x1e8))(pQVar5,index,0);
            QColumnViewPrivate::changeCurrentColumn(this_00);
            goto LAB_0056c7ad;
          }
        }
        LVar7 = QWidget::layoutDirection((QWidget *)this);
        if (LVar7 == RightToLeft) {
          if (iVar6 < 0) {
            pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            iVar6 = ((pQVar9->data->crect).x2.m_i - (iVar6 + (pQVar9->data->crect).x1.m_i)) + 1;
          }
          else {
            iVar6 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea
                                           .super_QFrame.super_QWidget + 0x2b0))(this);
            iVar6 = iVar6 + iVar11;
          }
        }
        else {
          iVar13 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget + 0x2b0))(this);
          if (iVar6 != -iVar13 && SBORROW4(iVar6,-iVar13) == iVar6 + iVar13 < 0) {
            pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            iVar6 = iVar11 + ~(pQVar9->data->crect).x2.m_i + (pQVar9->data->crect).x1.m_i;
          }
        }
        pQVar10 = QWidget::style((QWidget *)this);
        iVar13 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x71,0,this,0);
        if (iVar13 == 0) {
          this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
          QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar6);
        }
        else {
          DVar14 = (DeletionPolicy)&this_00->currentAnimation;
          QVariantAnimation::setDuration(DVar14);
          ::QVariant::QVariant((QVariant *)&local_58,iVar6);
          QVariantAnimation::setEndValue((QVariant *)&this_00->currentAnimation);
          ::QVariant::~QVariant((QVariant *)&local_58);
          QAbstractAnimation::start(DVar14);
        }
      }
    }
  }
LAB_0056c7ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QColumnView);
    Q_UNUSED(hint);
    if (!index.isValid() || d->columns.isEmpty())
        return;

#if QT_CONFIG(animation)
    if (d->currentAnimation.state() == QPropertyAnimation::Running)
        return;

    d->currentAnimation.stop();
#endif // animation

    // Fill up what is needed to get to index
    d->closeColumns(index, true);

    QModelIndex indexParent = index.parent();
    // Find the left edge of the column that contains index
    int currentColumn = 0;
    int leftEdge = 0;
    while (currentColumn < d->columns.size()) {
        if (indexParent == d->columns.at(currentColumn)->rootIndex())
            break;
        leftEdge += d->columns.at(currentColumn)->width();
        ++currentColumn;
    }

    // Don't let us scroll above the root index
    if (currentColumn == d->columns.size())
        return;

    int indexColumn = currentColumn;
    // Find the width of what we want to show (i.e. the right edge)
    int visibleWidth = d->columns.at(currentColumn)->width();
    // We want to always try to show two columns
    if (currentColumn + 1 < d->columns.size()) {
        ++currentColumn;
        visibleWidth += d->columns.at(currentColumn)->width();
    }

    int rightEdge = leftEdge + visibleWidth;
    if (isRightToLeft()) {
        leftEdge = viewport()->width() - leftEdge;
        rightEdge = leftEdge - visibleWidth;
        qSwap(rightEdge, leftEdge);
    }

    // If it is already visible don't animate
    if (leftEdge > -horizontalOffset()
        && rightEdge <= ( -horizontalOffset() + viewport()->size().width())) {
            d->columns.at(indexColumn)->scrollTo(index);
            d->changeCurrentColumn();
            return;
    }

    int newScrollbarValue = 0;
    if (isRightToLeft()) {
        if (leftEdge < 0) {
            // scroll to the right
            newScrollbarValue = viewport()->size().width() - leftEdge;
        } else {
            // scroll to the left
            newScrollbarValue = rightEdge + horizontalOffset();
        }
    } else {
        if (leftEdge > -horizontalOffset()) {
            // scroll to the right
            newScrollbarValue = rightEdge - viewport()->size().width();
        } else {
            // scroll to the left
            newScrollbarValue = leftEdge;
        }
    }

#if QT_CONFIG(animation)
    if (const int animationDuration = style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, this)) {
        d->currentAnimation.setDuration(animationDuration);
        d->currentAnimation.setEndValue(newScrollbarValue);
        d->currentAnimation.start();
    } else
#endif // animation
    {
        horizontalScrollBar()->setValue(newScrollbarValue);
    }
}